

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O0

TestResult * tr_create(void)

{
  TestResult *tr_00;
  TestResult *tr;
  
  tr_00 = (TestResult *)emalloc(0x38);
  tr_init(tr_00);
  return tr_00;
}

Assistant:

TestResult *tr_create(void)
{
    TestResult *tr;

    tr = (TestResult *)emalloc(sizeof(TestResult));
    tr_init(tr);
    return tr;
}